

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O1

uint64_t filemgr_update_header(filemgr *file,void *buf,size_t len,bool inc_revnum)

{
  filemgr_header_revnum_t *pfVar1;
  uint64_t uVar2;
  void *pvVar3;
  
  pthread_spin_lock(&file->lock);
  if ((file->header).data == (void *)0x0) {
    pvVar3 = malloc((ulong)file->blocksize);
    (file->header).data = pvVar3;
  }
  memcpy((file->header).data,buf,len);
  (file->header).size = (filemgr_header_len_t)len;
  if (inc_revnum) {
    pfVar1 = &(file->header).revnum;
    *pfVar1 = *pfVar1 + 1;
  }
  uVar2 = (file->header).revnum;
  pthread_spin_unlock(&file->lock);
  return uVar2;
}

Assistant:

uint64_t filemgr_update_header(struct filemgr *file,
                               void *buf,
                               size_t len,
                               bool inc_revnum)
{
    uint64_t ret;

    spin_lock(&file->lock);

    if (file->header.data == NULL) {
        file->header.data = (void *)malloc(file->blocksize);
    }
    memcpy(file->header.data, buf, len);
    file->header.size = len;
    if (inc_revnum) {
        ++(file->header.revnum);
    }
    ret = file->header.revnum;

    spin_unlock(&file->lock);

    return ret;
}